

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall
Assimp::ASE::Parser::ParseLV3MeshTFaceListBlock
          (Parser *this,uint iNumFaces,Mesh *mesh,uint iChannel)

{
  byte bVar1;
  pointer pFVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  byte *pbVar7;
  byte *pbVar8;
  uint iIndex;
  uint aiValues [3];
  int local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  pbVar8 = (byte *)this->filePtr;
  local_44 = 0;
  do {
    bVar1 = *pbVar8;
    pbVar7 = pbVar8;
    if (bVar1 == 0x2a) {
      while( true ) {
        pbVar8 = pbVar7 + 1;
        this->filePtr = (char *)pbVar8;
        iVar4 = strncmp("MESH_TFACE",(char *)pbVar8,10);
        if (iVar4 != 0) break;
        bVar1 = pbVar7[0xb];
        if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
        pbVar8 = pbVar7 + 0xc;
        if (bVar1 == 0) {
          pbVar8 = pbVar7 + 0xb;
        }
        this->filePtr = (char *)pbVar8;
        local_40 = 0;
        ParseLV4MeshLongTriple(this,&local_3c,&local_40);
        uVar5 = (ulong)local_40;
        if ((local_40 < iNumFaces) &&
           (pFVar2 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                     super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>.
                     _M_impl.super__Vector_impl_data._M_start,
           uVar6 = ((long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                          super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pFVar2 >> 2) *
                   0xf83e0f83e0f83e1, uVar5 <= uVar6 && uVar6 - uVar5 != 0)) {
          pFVar2[uVar5].amUVIndices[iChannel][0] = local_3c;
          (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
          super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
          super__Vector_impl_data._M_start[uVar5].amUVIndices[iChannel][1] = local_38;
          (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
          super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
          super__Vector_impl_data._M_start[uVar5].amUVIndices[iChannel][2] = local_34;
        }
        else {
          LogWarning(this,"UV-Face has an invalid index. It will be ignored");
        }
        pbVar8 = (byte *)this->filePtr;
        pbVar7 = pbVar8;
        if (*pbVar8 != 0x2a) break;
      }
      bVar1 = *pbVar8;
    }
    bVar3 = false;
    if (bVar1 < 0x7b) {
      if ((bVar1 - 0xc < 2) || (bVar1 == 10)) {
        if (this->bLastWasEndLine != false) goto LAB_00403e97;
        this->iLineNumber = this->iLineNumber + 1;
        bVar3 = true;
      }
      else if (bVar1 == 0) {
        LogError(this,"Encountered unexpected EOL while parsing a *MESH_TFACE_LIST chunk (Level 3)")
        ;
      }
    }
    else {
      if (bVar1 == 0x7d) {
        local_44 = local_44 + -1;
        if (local_44 == 0) {
          this->filePtr = (char *)(pbVar8 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else {
        if (bVar1 != 0x7b) goto LAB_00403e99;
        local_44 = local_44 + 1;
      }
LAB_00403e97:
      bVar3 = false;
    }
LAB_00403e99:
    this->bLastWasEndLine = bVar3;
    pbVar8 = pbVar8 + 1;
    this->filePtr = (char *)pbVar8;
  } while( true );
}

Assistant:

void Parser::ParseLV3MeshTFaceListBlock(unsigned int iNumFaces,
    ASE::Mesh& mesh, unsigned int iChannel)
{
    AI_ASE_PARSER_INIT();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Face entry
            if (TokenMatch(filePtr,"MESH_TFACE" ,10))
            {
                unsigned int aiValues[3];
                unsigned int iIndex = 0;

                ParseLV4MeshLongTriple(aiValues,iIndex);
                if (iIndex >= iNumFaces || iIndex >= mesh.mFaces.size())
                {
                    LogWarning("UV-Face has an invalid index. It will be ignored");
                }
                else
                {
                    // copy UV indices
                    mesh.mFaces[iIndex].amUVIndices[iChannel][0] = aiValues[0];
                    mesh.mFaces[iIndex].amUVIndices[iChannel][1] = aiValues[1];
                    mesh.mFaces[iIndex].amUVIndices[iChannel][2] = aiValues[2];
                }
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_TFACE_LIST");
    }
    return;
}